

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall
CLIntercept::setKernelArg
          (CLIntercept *this,cl_kernel kernel,cl_uint arg_index,void *arg_value,size_t arg_size)

{
  mutex *__mutex;
  _Rb_tree_header *p_Var1;
  mapped_type pvVar2;
  pointer puVar3;
  bool bVar4;
  int iVar5;
  _Base_ptr p_Var6;
  mapped_type *this_00;
  mapped_type *ppvVar7;
  mapped_type *this_01;
  mapped_type *pmVar8;
  mapped_type *this_02;
  mapped_type *pmVar9;
  mapped_type *this_03;
  mapped_type_conflict *pmVar10;
  undefined8 uVar11;
  _Base_ptr p_Var12;
  string samplerString;
  cl_uint local_78;
  allocator_type local_71;
  cl_kernel local_70;
  pointer local_68;
  pointer puStack_60;
  pointer local_58;
  string local_48;
  
  __mutex = &this->m_Mutex;
  local_78 = arg_index;
  local_70 = kernel;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar5 == 0) {
    if (arg_value == (void *)0x0) {
      this_03 = std::
                map<_cl_kernel_*,_std::map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>_>_>_>
                ::operator[](&this->m_KernelArgLocalSizeMap,&local_70);
      pmVar10 = std::
                map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                ::operator[](this_03,&local_78);
      *pmVar10 = arg_size;
    }
    else {
      if ((arg_size == 8) &&
         (p_Var6 = (this->m_MemAllocNumberMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                   _M_parent, p_Var6 != (_Base_ptr)0x0)) {
        pvVar2 = *arg_value;
        p_Var1 = &(this->m_MemAllocNumberMap)._M_t._M_impl.super__Rb_tree_header;
        p_Var12 = &p_Var1->_M_header;
        do {
          if (*(mapped_type *)(p_Var6 + 1) >= pvVar2) {
            p_Var12 = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[*(mapped_type *)(p_Var6 + 1) < pvVar2];
        } while (p_Var6 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var12 != p_Var1) && (*(mapped_type *)(p_Var12 + 1) <= pvVar2)) {
          this_00 = std::
                    map<_cl_kernel_*,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>_>_>_>
                    ::operator[](&this->m_KernelArgMemMap,&local_70);
          ppvVar7 = std::
                    map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>
                    ::operator[](this_00,&local_78);
          *ppvVar7 = pvVar2;
        }
      }
      local_48._M_string_length = 0;
      local_48.field_2._M_local_buf[0] = '\0';
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      bVar4 = checkGetSamplerString(this,arg_size,arg_value,&local_48);
      if (bVar4) {
        this_01 = std::
                  map<_cl_kernel_*,_std::map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  ::operator[](&this->m_KernelArgSamplerMap,&local_70);
        pmVar8 = std::
                 map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](this_01,&local_78);
        std::__cxx11::string::_M_assign((string *)pmVar8);
      }
      this_02 = std::
                map<_cl_kernel_*,_std::map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>_>
                ::operator[](&this->m_KernelArgDataMap,&local_70);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_68,(uchar *)arg_value
                 ,(uchar *)(arg_size + (long)arg_value),&local_71);
      pmVar9 = std::
               map<unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ::operator[](this_02,&local_78);
      puVar3 = (pmVar9->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      (pmVar9->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start = local_68;
      (pmVar9->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = puStack_60;
      (pmVar9->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_58;
      local_68 = (pointer)0x0;
      puStack_60 = (pointer)0x0;
      local_58 = (pointer)0x0;
      if (puVar3 != (pointer)0x0) {
        operator_delete(puVar3);
        if (local_68 != (pointer)0x0) {
          operator_delete(local_68);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar11 = std::__throw_system_error(iVar5);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar11);
}

Assistant:

void CLIntercept::setKernelArg(
    cl_kernel kernel,
    cl_uint arg_index,
    const void* arg_value,
    size_t arg_size )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    if( arg_value != nullptr )
    {
        if( arg_size == sizeof(cl_mem) )
        {
            cl_mem  mem = ((cl_mem*)arg_value)[0];
            if( m_MemAllocNumberMap.find(mem) != m_MemAllocNumberMap.end() )
            {
                CArgMemMap& argMemMap = m_KernelArgMemMap[ kernel ];
                argMemMap[ arg_index ] = mem;
            }
        }

        std::string samplerString;
        if( checkGetSamplerString( arg_size, arg_value, samplerString) )
        {
            CArgSamplerMap& argSamplerMap = m_KernelArgSamplerMap[kernel];
            argSamplerMap[ arg_index ] = samplerString;
        }

        CArgDataMap& argDataMap = m_KernelArgDataMap[kernel];
        const uint8_t* pRawArgData = reinterpret_cast<const uint8_t*>(arg_value);
        argDataMap[ arg_index ] = std::vector<uint8_t>(
            pRawArgData, pRawArgData + arg_size );
    }
    else
    {
        CArgLocalSizeMap& argMap = m_KernelArgLocalSizeMap[ kernel ];
        argMap[ arg_index ] = arg_size;
    }
}